

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioContextManager.cpp
# Opt level: O3

io_context * gmlc::networking::AsioContextManager::getExistingContext(string *contextName)

{
  io_context *piVar1;
  invalid_argument *this;
  shared_ptr<gmlc::networking::AsioContextManager> ptr;
  _func_int **local_20;
  element_type *local_18;
  
  getExistingContextPointer((AsioContextManager *)&stack0xffffffffffffffe0,contextName);
  if (local_20 != (_func_int **)0x0) {
    piVar1 = (io_context *)local_20[8];
    if (local_18 != (element_type *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18);
    }
    return piVar1;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"the context name specified was not available");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

asio::io_context&
    AsioContextManager::getExistingContext(const std::string& contextName)
{
    auto ptr = getExistingContextPointer(contextName);
    if (ptr) {
        return ptr->getBaseContext();
    }
    throw(
        std::invalid_argument("the context name specified was not available"));
}